

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolderTests.cpp
# Opt level: O0

void __thiscall SOH_basic_Test::~SOH_basic_Test(SOH_basic_Test *this)

{
  SOH_basic_Test *this_local;
  
  ~SOH_basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SOH, basic)
{
    SearchableObjectHolder<std::string> SOH1;
    SOH1.addObject("test1", std::make_shared<std::string>("test_1"));

    auto res = SOH1.findObject("test1");
    ASSERT_TRUE(res);
    EXPECT_EQ(*res, "test_1");

    SOH1.removeObject("test1");
    auto res2 = SOH1.findObject("test1");
    EXPECT_FALSE(res2);
}